

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharmmTorsionType.cpp
# Opt level: O3

void __thiscall
OpenMD::CharmmTorsionType::CharmmTorsionType
          (CharmmTorsionType *this,
          vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
          *parameters)

{
  _Rb_tree_header *p_Var1;
  int maxPower;
  pointer pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  double dVar6;
  ChebyshevU U;
  ChebyshevT T;
  DoublePolynomial sinTerm;
  DoublePolynomial cosTerm;
  ChebyshevU local_e0;
  ChebyshevT local_b8;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_60;
  
  (this->super_TorsionType)._vptr_TorsionType = (_func_int **)&PTR__CharmmTorsionType_002f7ac0;
  p_Var1 = &(this->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header;
  (this->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->T_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->U_).polyPairMap_._M_t._M_impl.super__Rb_tree_header;
  (this->U_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->U_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->U_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->U_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->U_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->C_ = 0.0;
  pCVar5 = (parameters->
           super__Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (parameters->
           super__Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pCVar4 = pCVar5 + 1;
  if (pCVar4 != pCVar2 && pCVar5 != pCVar2) {
    do {
      pCVar3 = pCVar4;
      if (pCVar4->n <= pCVar5->n) {
        pCVar3 = pCVar5;
      }
      pCVar5 = pCVar3;
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 != pCVar2);
  }
  if (pCVar5 != pCVar2) {
    maxPower = pCVar5->n;
    ChebyshevT::ChebyshevT(&local_b8,maxPower);
    ChebyshevU::ChebyshevU(&local_e0,maxPower);
    pCVar5 = (parameters->
             super__Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pCVar5 != (parameters->
                  super__Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::_Rb_tree(&local_60,
                   (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)(local_b8.polyList_.
                       super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + pCVar5->n));
        dVar6 = cos(pCVar5->delta);
        Polynomial<double>::operator*=((Polynomial<double> *)&local_60,dVar6 * pCVar5->kchi);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::_Rb_tree(&local_90,
                   (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)(local_e0.polyList_.
                       super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)pCVar5->n + -1));
        dVar6 = sin(pCVar5->delta);
        Polynomial<double>::operator*=((Polynomial<double> *)&local_90,-dVar6 * pCVar5->kchi);
        Polynomial<double>::operator+=(&this->T_,(PolynomialType *)&local_60);
        Polynomial<double>::operator+=(&this->U_,(PolynomialType *)&local_90);
        this->C_ = pCVar5->kchi + this->C_;
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::~_Rb_tree(&local_90);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::~_Rb_tree(&local_60);
        pCVar5 = pCVar5 + 1;
      } while (pCVar5 != (parameters->
                         super__Vector_base<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    local_e0._vptr_ChebyshevU = (_func_int **)&PTR__ChebyshevU_002f7b00;
    std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::~vector
              (&local_e0.polyList_);
    local_b8._vptr_ChebyshevT = (_func_int **)&PTR__ChebyshevT_002f7b30;
    std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::~vector
              (&local_b8.polyList_);
  }
  return;
}

Assistant:

CharmmTorsionType::CharmmTorsionType(
      std::vector<CharmmTorsionParameter>& parameters) :
      TorsionType(),
      C_(0.0) {
    std::vector<CharmmTorsionParameter>::iterator i;
    i = std::max_element(parameters.begin(), parameters.end(),
                         LessThanPeriodicityFunctor());
    if (i != parameters.end()) {
      int maxPower = i->n;
      ChebyshevT T(maxPower);
      ChebyshevU U(maxPower);

      // convert parameters of charmm type torsion into
      // Polynomial parameters

      for (i = parameters.begin(); i != parameters.end(); ++i) {
        DoublePolynomial cosTerm = T.getChebyshevPolynomial(i->n);
        cosTerm *= (cos(i->delta) * i->kchi);

        // should check that i->n is >= 1
        DoublePolynomial sinTerm = U.getChebyshevPolynomial(i->n - 1);
        sinTerm *= -(sin(i->delta) * i->kchi);

        T_ += cosTerm;
        U_ += sinTerm;
        C_ += i->kchi;
      }
    }
  }